

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<16u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Ch CVar5;
  bool bVar6;
  bool bVar7;
  MemoryStream *pMVar8;
  byte *pbVar9;
  char *pcVar10;
  long lVar11;
  byte *pbVar12;
  ulong uVar13;
  int iVar14;
  ulong decimalPosition;
  char *pcVar15;
  ulong i;
  int iVar16;
  int iVar17;
  uint i_00;
  double d;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double local_88;
  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
  s;
  
  s.stackStream.length_ = 0;
  lVar11 = (long)is->is_->src_ - (long)is->is_->begin_;
  s.
  super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
  .is = is;
  s.stackStream.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
  bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,true,false>>
                    (&s,'-');
  pMVar8 = (s.
            super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
           .is)->is_;
  pcVar10 = pMVar8->src_;
  if (pcVar10 == pMVar8->end_) {
LAB_0047652e:
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                    ,0x4b2,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar11 = (long)pcVar10 - (long)pMVar8->begin_;
    *(undefined4 *)(this + 0x30) = 3;
    goto LAB_00476442;
  }
  if (*pcVar10 == '0') {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
    ::TakePush(&s);
    local_88 = 0.0;
    bVar7 = false;
    bVar3 = false;
    iVar16 = 0;
    i = 0;
    bVar2 = false;
    i_00 = 0;
  }
  else {
    if (8 < (byte)(*pcVar10 - 0x31U)) goto LAB_0047652e;
    CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
            ::TakePush(&s);
    i_00 = (int)CVar5 - 0x30;
    iVar16 = 0;
    if (bVar4) {
LAB_00475ef5:
      pMVar8 = (s.
                super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
               .is)->is_;
      pbVar12 = (byte *)pMVar8->src_;
      if ((pbVar12 == (byte *)pMVar8->end_) || (9 < (byte)(*pbVar12 - 0x30))) goto LAB_00476033;
      if (i_00 < 0xccccccc) {
LAB_00475f22:
        CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                ::TakePush(&s);
        i_00 = (i_00 * 10 + (int)CVar5) - 0x30;
        iVar16 = iVar16 + 1;
        goto LAB_00475ef5;
      }
      if (i_00 != 0xccccccc) goto LAB_00475fa3;
      if (*pbVar12 != 0x39) goto LAB_00475f22;
      i_00 = 0xccccccc;
LAB_00475fa3:
      i = (ulong)i_00;
      if (bVar4) {
LAB_00475fc3:
        if ((pbVar12 == (byte *)pMVar8->end_) || (9 < (byte)(*pbVar12 - 0x30))) goto LAB_00476147;
        if (i < 0xccccccccccccccc) {
LAB_00475fe4:
          CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                  ::TakePush(&s);
          i = (ulong)((int)CVar5 - 0x30) + i * 10;
          iVar16 = iVar16 + 1;
          pMVar8 = (s.
                    super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                   .is)->is_;
          pbVar12 = (byte *)pMVar8->src_;
          goto LAB_00475fc3;
        }
        if (i != 0xccccccccccccccc) goto LAB_004760ce;
        if (*pbVar12 != 0x39) goto LAB_00475fe4;
        i = 0xccccccccccccccc;
LAB_004760ce:
        auVar18._8_4_ = (int)(i >> 0x20);
        auVar18._0_8_ = i;
        auVar18._12_4_ = 0x45300000;
        local_88 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
        while ((pbVar12 != (byte *)pMVar8->end_ && ((byte)(*pbVar12 - 0x30) < 10))) {
          if (1.7976931348623158e+307 <= local_88) {
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                            ,0x4d3,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_00476436;
          }
          CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                  ::TakePush(&s);
          local_88 = local_88 * 10.0 + (double)(CVar5 + -0x30);
          pMVar8 = (s.
                    super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                   .is)->is_;
          pbVar12 = (byte *)pMVar8->src_;
        }
        bVar7 = true;
        bVar3 = true;
        bVar2 = true;
      }
      else {
        while ((pbVar12 != (byte *)pMVar8->end_ && ((byte)(*pbVar12 - 0x30) < 10))) {
          if (0x1999999999999998 < i) {
            if (i != 0x1999999999999999) goto LAB_004760ce;
            if (0x35 < *pbVar12) {
              i = 0x1999999999999999;
              goto LAB_004760ce;
            }
          }
          CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::
                  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                  ::TakePush(&s);
          i = (ulong)((int)CVar5 - 0x30) + i * 10;
          iVar16 = iVar16 + 1;
          pMVar8 = (s.
                    super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                   .is)->is_;
          pbVar12 = (byte *)pMVar8->src_;
        }
LAB_00476147:
        bVar2 = true;
        local_88 = 0.0;
        bVar7 = false;
        bVar3 = false;
      }
    }
    else {
      while( true ) {
        pMVar8 = (s.
                  super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                 .is)->is_;
        pbVar12 = (byte *)pMVar8->src_;
        if ((pbVar12 == (byte *)pMVar8->end_) || (9 < (byte)(*pbVar12 - 0x30))) break;
        if (0x19999998 < i_00) {
          if (i_00 != 0x19999999) goto LAB_00475fa3;
          if (0x35 < *pbVar12) {
            i_00 = 0x19999999;
            goto LAB_00475fa3;
          }
        }
        CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                ::TakePush(&s);
        i_00 = (i_00 * 10 + (int)CVar5) - 0x30;
        iVar16 = iVar16 + 1;
      }
LAB_00476033:
      local_88 = 0.0;
      bVar7 = false;
      bVar3 = false;
      i = 0;
      bVar2 = false;
    }
  }
  bVar6 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,true,false>>
                    (&s,'.');
  decimalPosition = (ulong)s.stackStream.length_;
  iVar17 = 0;
  if (bVar6) {
    pMVar8 = (s.
              super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
             .is)->is_;
    pbVar9 = (byte *)pMVar8->src_;
    pbVar12 = (byte *)pMVar8->end_;
    if ((pbVar9 == pbVar12) || ((byte)(*pbVar9 - 0x3a) < 0xf6)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                      ,0x4df,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar11 = (long)pbVar9 - (long)pMVar8->begin_;
      *(undefined4 *)(this + 0x30) = 0xe;
      goto LAB_00476442;
    }
    iVar17 = 0;
    if (!bVar7) {
      if (!bVar2) {
        i = (ulong)i_00;
      }
      iVar17 = 0;
      while ((((pbVar9 != pbVar12 && ('/' < (char)*pbVar9)) && (*pbVar9 < 0x3a)) && (i >> 0x35 == 0)
             )) {
        CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::
                NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
                ::TakePush(&s);
        iVar17 = iVar17 + -1;
        i = (ulong)((int)CVar5 - 0x30) + i * 10;
        iVar16 = iVar16 + (uint)(i != 0);
        pMVar8 = (s.
                  super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
                 .is)->is_;
        pbVar9 = (byte *)pMVar8->src_;
        pbVar12 = (byte *)pMVar8->end_;
      }
      auVar19._8_4_ = (int)(i >> 0x20);
      auVar19._0_8_ = i;
      auVar19._12_4_ = 0x45300000;
      local_88 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar3 = true;
    }
    while ((pbVar9 != (byte *)pMVar8->end_ && ((byte)(*pbVar9 - 0x30) < 10))) {
      CVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
              ::TakePush(&s);
      if (iVar16 < 0x11) {
        local_88 = (double)(CVar5 + -0x30) + local_88 * 10.0;
        iVar17 = iVar17 + -1;
        if (0.0 < local_88) {
          iVar16 = iVar16 + 1;
        }
      }
      pMVar8 = (s.
                super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
               .is)->is_;
      pbVar9 = (byte *)pMVar8->src_;
    }
  }
  bVar7 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,true,false>>
                    (&s,'e');
  if (bVar7) {
LAB_004762f9:
    uVar13 = (ulong)i_00;
    if (bVar2) {
      uVar13 = i;
    }
    if (!bVar3) {
      auVar20._8_4_ = (int)(uVar13 >> 0x20);
      auVar20._0_8_ = uVar13;
      auVar20._12_4_ = 0x45300000;
      local_88 = (auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      bVar3 = true;
    }
    bVar7 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,true,false>>
                      (&s,'+');
    if (bVar7) {
      bVar7 = false;
    }
    else {
      bVar7 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,true,false>>
                        (&s,'-');
    }
    pMVar8 = (s.
              super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
             .is)->is_;
    pcVar10 = pMVar8->src_;
    pcVar1 = pMVar8->end_;
    if ((pcVar10 == pcVar1) || (9 < (byte)(*pcVar10 - 0x30U))) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                      ,0x52b,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar11 = (long)pcVar10 - (long)pMVar8->begin_;
      *(undefined4 *)(this + 0x30) = 0xf;
      goto LAB_00476442;
    }
    pcVar15 = pcVar10 + 1;
    pMVar8->src_ = pcVar15;
    iVar14 = *pcVar10 + -0x30;
    if (bVar7 == false) {
      do {
        if ((pcVar15 == pcVar1) || (9 < (byte)(*pcVar15 - 0x30U))) goto LAB_0047644d;
        pMVar8->src_ = pcVar15 + 1;
        iVar14 = iVar14 * 10 + (int)*pcVar15 + -0x30;
        pcVar15 = pcVar15 + 1;
      } while (iVar14 <= 0x134 - iVar17);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                      ,0x526,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_00476436:
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_00476442;
    }
    while ((pcVar15 != pcVar1 && ((byte)(*pcVar15 - 0x30U) < 10))) {
      pcVar10 = pcVar15 + 1;
      pMVar8->src_ = pcVar10;
      iVar14 = iVar14 * 10 + (int)*pcVar15 + -0x30;
      pcVar15 = pcVar10;
      if (0xccccccb < iVar14) {
        while ((pcVar15 != pcVar1 && ((byte)(*pcVar15 - 0x30U) < 10))) {
          pcVar15 = pcVar15 + 1;
          pMVar8->src_ = pcVar15;
        }
      }
    }
LAB_0047644d:
    iVar16 = -iVar14;
    if (bVar7 == false) {
      iVar16 = iVar14;
    }
  }
  else {
    bVar7 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,true,false>>
                      (&s,'E');
    iVar16 = 0;
    if (bVar7) goto LAB_004762f9;
  }
  uVar13 = (ulong)s.stackStream.length_;
  pcVar10 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
            ::Pop(&s);
  if (bVar3) {
    d = internal::StrtodFullPrecision
                  (local_88,iVar17 + iVar16,pcVar10,uVar13,decimalPosition,iVar16);
    if (bVar4) {
      d = -d;
    }
    bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Double(handler,d);
  }
  else if (bVar2) {
    if (bVar4) {
      bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int64(handler,-i);
    }
    else {
      bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint64(handler,i);
    }
  }
  else if (bVar4) {
    bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int(handler,-i_00);
  }
  else {
    bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Uint(handler,i_00);
  }
  if (bVar4 != false) {
    return;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                  ,0x56b,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_00476442:
  *(long *)(this + 0x38) = lVar11;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            useNanOrInf = true;
            if (RAPIDJSON_LIKELY(Consume(s, 'N') && Consume(s, 'a') && Consume(s, 'N'))) {
                d = std::numeric_limits<double>::quiet_NaN();
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I') && Consume(s, 'n') && Consume(s, 'f'))) {
                d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                            && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y'))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }